

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

void __thiscall Buffer::~Buffer(Buffer *this)

{
  MutableBuffer::~MutableBuffer((MutableBuffer *)this);
  operator_delete(this,0x50);
  return;
}

Assistant:

Buffer::~Buffer() {
  if (owned && (data != nullptr)) {
    ::free(data);
  }
}